

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  ImDrawList **ppIVar5;
  ImDrawList *pIVar6;
  ImDrawCmd *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int i;
  long lVar11;
  long lVar12;
  int cmd_i;
  long lVar13;
  float fVar14;
  float fVar15;
  
  iVar3 = this->CmdListsCount;
  ppIVar5 = this->CmdLists;
  for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
    pIVar6 = ppIVar5[lVar11];
    iVar4 = (pIVar6->CmdBuffer).Size;
    lVar12 = 0;
    for (lVar13 = 0; lVar13 < iVar4; lVar13 = lVar13 + 1) {
      pIVar7 = (pIVar6->CmdBuffer).Data;
      pfVar1 = (float *)((long)&(pIVar7->ClipRect).x + lVar12);
      fVar8 = pfVar1[1];
      fVar9 = pfVar1[2];
      fVar10 = pfVar1[3];
      fVar14 = (*fb_scale).x;
      fVar15 = (*fb_scale).y;
      pfVar2 = (float *)((long)&(pIVar7->ClipRect).x + lVar12);
      *pfVar2 = *pfVar1 * fVar14;
      pfVar2[1] = fVar8 * fVar15;
      pfVar2[2] = fVar9 * fVar14;
      pfVar2[3] = fVar10 * fVar15;
      lVar12 = lVar12 + 0x38;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}